

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O3

int __thiscall
ncnn::DeformableConv2D_x86::forward
          (DeformableConv2D_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar12;
  undefined8 uVar13;
  uint _w;
  _func_int *p_Var14;
  int *piVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  uint _h;
  _func_int **pp_Var19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  void *pvVar29;
  float *pfVar30;
  Mat *this_00;
  bool bVar31;
  float __x;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ulong local_2b0;
  ulong local_2a0;
  _func_int *local_290;
  Mat local_288;
  ulong local_238;
  int local_230;
  int local_22c;
  float local_228;
  float local_224;
  float local_220;
  int local_21c;
  int local_218;
  int local_214;
  ulong local_210;
  _func_int **local_208;
  pointer local_200;
  Mat local_1f8;
  Mat *local_1b0;
  Option *local_1a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a0;
  ulong local_198;
  ulong local_190;
  void *local_188;
  long local_180;
  _func_int **local_178;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_170;
  pointer local_168;
  void *local_160;
  void *local_158;
  DeformableConv2D_x86 *local_150;
  _func_int **local_148;
  Mat local_140;
  undefined1 local_f8 [16];
  float local_e8;
  undefined1 local_d8 [16];
  Mat local_c0;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_200 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_238 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  p_Var14 = this->_vptr_DeformableConv2D_x86[-3];
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  uVar8 = (long)(~((*(int *)(&this->field_0xd4 + (long)p_Var14) + -1) *
                  *(int *)(&this->field_0xdc + (long)p_Var14)) + pMVar3->w +
                 *(int *)(&this->field_0xec + (long)p_Var14) +
                *(int *)(&this->field_0xf0 + (long)p_Var14)) /
          (long)*(int *)(&this->field_0xe4 + (long)p_Var14);
  local_190 = uVar8 & 0xffffffff;
  iVar17 = (~((*(int *)(&this->field_0xd8 + (long)p_Var14) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var14)) + iVar1 +
            *(int *)(&this->field_0xf4 + (long)p_Var14) +
           *(int *)(&this->field_0xf8 + (long)p_Var14)) /
           *(int *)(&this->field_0xe8 + (long)p_Var14);
  _w = (int)uVar8 + 1;
  local_1f8.cstep = 0;
  _h = iVar17 + 1;
  iVar20 = _h * _w;
  local_1f8.data = (void *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize._0_4_ = 0;
  local_1f8.elemsize._4_4_ = 0;
  local_1f8.elempack = 0;
  local_1f8.allocator = (Allocator *)0x0;
  local_1f8.dims = 0;
  local_1f8.w = 0;
  local_1f8.h = 0;
  local_1f8.d = 0;
  local_1f8.c = 0;
  local_170 = bottom_blobs;
  Mat::create(&local_1f8,
              *(int *)(&this->field_0xd8 + (long)p_Var14) * iVar2 *
              *(int *)(&this->field_0xd4 + (long)p_Var14) * iVar20,_elemsize,opt->blob_allocator);
  iVar21 = -100;
  if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0)) {
    this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_230 = iVar20;
    local_1a0 = top_blobs;
    Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]),
                iVar20,_elemsize,opt->blob_allocator);
    iVar21 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar21 = iVar1 * (int)local_238;
      Mat::reshape(&local_78,pMVar3,iVar21 * iVar2,(Allocator *)0x0);
      Mat::reshape(&local_c0,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      pp_Var19 = this->_vptr_DeformableConv2D_x86;
      if (-1 < iVar17) {
        local_200 = (pointer)((long)local_200 - (long)pMVar3);
        local_158 = local_78.data;
        fVar41 = (float)iVar1;
        local_160 = local_c0.data;
        fVar42 = (float)(int)local_238;
        local_188 = local_1f8.data;
        local_22c = (int)local_238 + -1;
        local_210 = (ulong)_w;
        local_198 = (ulong)_h;
        local_2b0 = 0;
        local_228 = fVar42;
        local_224 = fVar41;
        local_1b0 = this_00;
        local_1a8 = opt;
        local_178 = pp_Var19;
        local_150 = this;
        do {
          if (-1 < (int)local_190) {
            local_180 = local_2b0 * local_210;
            local_208 = this->_vptr_DeformableConv2D_x86;
            p_Var14 = pp_Var19[-3];
            local_2a0 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd8 + (long)p_Var14)) {
                local_218 = *(int *)(&this->field_0xe8 + (long)p_Var14) * (int)local_2b0 -
                            *(int *)(&this->field_0xf4 + (long)p_Var14);
                iVar20 = (int)local_2a0;
                local_21c = *(int *)(&this->field_0xe4 + (long)p_Var14) * iVar20 -
                            *(int *)(&this->field_0xec + (long)p_Var14);
                pfVar30 = (float *)((long)local_188 +
                                   (long)(((int)local_180 + iVar20) * iVar2 *
                                          *(int *)(&this->field_0xd8 + (long)p_Var14) *
                                         *(int *)(&this->field_0xd4 + (long)p_Var14)) * 4);
                local_148 = this->_vptr_DeformableConv2D_x86;
                local_290 = local_208[-3];
                iVar17 = 0;
                do {
                  iVar16 = *(int *)(&this->field_0xd4 + (long)local_290);
                  if (0 < iVar16) {
                    local_168 = (local_170->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                    iVar23 = 0;
                    local_214 = iVar17;
                    do {
                      iVar17 = iVar16 * local_214 + iVar23;
                      fVar43 = 1.0;
                      if (local_200 == (pointer)0xd8) {
                        fVar43 = *(float *)((long)local_168[2].data +
                                           local_2a0 * 4 +
                                           (long)local_168[2].w * local_2b0 * local_168[2].elemsize
                                           + (long)iVar17 * local_168[2].cstep *
                                             local_168[2].elemsize);
                      }
                      __x = (float)(*(int *)(&this->field_0xe0 + (long)local_148[-3]) * local_214 +
                                   local_218) +
                            *(float *)((long)local_160 +
                                      (long)(int)((iVar17 * 2 * _h + (int)local_2b0) * _w + iVar20)
                                      * 4);
                      fVar36 = (float)(*(int *)(&this->field_0xdc + (long)local_148[-3]) * iVar23 +
                                      local_21c) +
                               *(float *)((long)local_160 +
                                         (long)(int)(((iVar17 * 2 + 1) * _h + (int)local_2b0) * _w +
                                                    iVar20) * 4);
                      bVar6 = fVar41 <= __x;
                      bVar7 = fVar42 <= fVar36;
                      if ((bVar7 || bVar6) || (fVar36 <= -1.0 || __x <= -1.0)) {
                        fVar32 = 0.0;
                        fVar33 = 0.0;
                        fVar34 = 0.0;
                        fVar35 = 0.0;
                        bVar31 = false;
                        bVar10 = false;
                        bVar9 = false;
                        bVar18 = false;
                        lVar24 = 0;
                        lVar25 = 0;
                        lVar27 = 0;
                        lVar28 = 0;
                      }
                      else {
                        local_d8 = ZEXT416((uint)__x);
                        local_f8 = ZEXT416((uint)fVar36);
                        local_220 = fVar43;
                        local_e8 = floorf(__x);
                        uVar22 = (uint)local_e8;
                        fVar41 = floorf((float)local_f8._0_4_);
                        uVar26 = (uint)fVar41;
                        fVar42 = (float)local_d8._0_4_ - (float)(int)local_e8;
                        fVar41 = (float)local_f8._0_4_ - (float)(int)uVar26;
                        bVar4 = (int)uVar26 < local_22c;
                        bVar10 = -1 < (int)uVar22 && bVar4;
                        bVar5 = (int)uVar22 < iVar1 + -1;
                        bVar9 = -1 < (int)uVar26 && bVar5;
                        bVar18 = bVar5 && bVar4;
                        iVar17 = (int)local_238 * uVar22;
                        bVar31 = -1 < (int)(uVar22 | uVar26);
                        lVar24 = (long)(int)(iVar17 + uVar26);
                        if (!bVar31) {
                          lVar24 = 0;
                        }
                        lVar25 = (long)(int)(iVar17 + uVar26 + 1);
                        if (-1 >= (int)uVar22 || !bVar4) {
                          lVar25 = 0;
                        }
                        iVar17 = (uVar22 + 1) * (int)local_238;
                        lVar27 = (long)(int)(uVar26 + iVar17);
                        if (-1 >= (int)uVar26 || !bVar5) {
                          lVar27 = 0;
                        }
                        lVar28 = (long)(int)(iVar17 + uVar26 + 1);
                        if (!bVar5 || !bVar4) {
                          lVar28 = 0;
                        }
                        fVar32 = (1.0 - fVar41) * fVar42;
                        fVar33 = fVar42 * fVar41;
                        fVar34 = fVar41 * (1.0 - fVar42);
                        fVar35 = (1.0 - fVar42) * (1.0 - fVar41);
                        fVar41 = local_224;
                        fVar42 = local_228;
                        fVar43 = local_220;
                      }
                      pvVar29 = local_158;
                      iVar17 = iVar2;
                      if (0 < iVar2) {
                        do {
                          fVar37 = 0.0;
                          if ((!bVar7 && !bVar6) && (fVar36 > -1.0 && __x > -1.0)) {
                            fVar38 = 0.0;
                            if (bVar31) {
                              fVar38 = *(float *)((long)pvVar29 + lVar24 * 4);
                            }
                            if (bVar10) {
                              fVar37 = *(float *)((long)pvVar29 + lVar25 * 4);
                            }
                            fVar40 = 0.0;
                            fVar39 = 0.0;
                            if (bVar9) {
                              fVar39 = *(float *)((long)pvVar29 + lVar27 * 4);
                            }
                            if (bVar18) {
                              fVar40 = *(float *)((long)pvVar29 + lVar28 * 4);
                            }
                            fVar37 = fVar38 * fVar35 + fVar40 * fVar33 +
                                     fVar37 * fVar34 + fVar39 * fVar32;
                          }
                          *pfVar30 = fVar37 * fVar43;
                          pfVar30 = pfVar30 + 1;
                          pvVar29 = (void *)((long)pvVar29 + (long)iVar21 * 4);
                          iVar17 = iVar17 + -1;
                        } while (iVar17 != 0);
                        local_290 = local_208[-3];
                      }
                      iVar23 = iVar23 + 1;
                      iVar16 = *(int *)(&local_150->field_0xd4 + (long)local_290);
                      this = local_150;
                    } while (iVar23 < iVar16);
                    p_Var14 = local_178[-3];
                    pp_Var19 = local_178;
                    iVar17 = local_214;
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 < *(int *)(&this->field_0xd8 + (long)p_Var14));
              }
              local_2a0 = local_2a0 + 1;
            } while (local_2a0 != local_210);
          }
          local_2b0 = local_2b0 + 1;
        } while (local_2b0 != local_198);
        pp_Var19 = this->_vptr_DeformableConv2D_x86;
        this_00 = local_1b0;
        opt = local_1a8;
      }
      Mat::reshape(&local_288,&local_1f8,
                   iVar2 * *(int *)(&this->field_0xd8 + (long)pp_Var19[-3]) *
                   *(int *)(&this->field_0xd4 + (long)pp_Var19[-3]),local_230,(Allocator *)0x0);
      piVar15 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      piVar15 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      local_1f8.data = local_288.data;
      local_1f8.refcount._0_4_ = local_288.refcount._0_4_;
      local_1f8.refcount._4_4_ = local_288.refcount._4_4_;
      local_1f8.elemsize._0_4_ = (undefined4)local_288.elemsize;
      local_1f8.elemsize._4_4_ = local_288.elemsize._4_4_;
      local_1f8.elempack = local_288.elempack;
      local_1f8.allocator = local_288.allocator;
      local_1f8.dims = local_288.dims;
      local_1f8.w = local_288.w;
      local_1f8.h = local_288.h;
      uVar11._0_4_ = local_288.d;
      uVar11._4_4_ = local_288.c;
      local_1f8.d = local_288.d;
      local_1f8.c = local_288.c;
      local_1f8.cstep = local_288.cstep;
      uVar13 = uVar11;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        uVar13 = local_1f8._52_8_;
        if (*piVar15 == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if (local_288.data != (void *)0x0) {
              local_1f8._52_8_ = uVar11;
              free(local_288.data);
              uVar13 = local_1f8._52_8_;
            }
          }
          else {
            local_1f8._52_8_ = uVar11;
            (*(local_288.allocator)->_vptr_Allocator[3])();
            uVar13 = local_1f8._52_8_;
          }
        }
      }
      local_1f8._52_8_ = uVar13;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_1f8,this_00,opt);
      local_288.cstep = 0;
      local_288.data = (void *)0x0;
      local_288.refcount._0_4_ = 0;
      local_288.refcount._4_4_ = 0;
      local_288.elemsize._0_4_ = 0;
      local_288.elemsize._4_4_ = 0;
      local_288.elempack = 0;
      local_288.allocator = (Allocator *)0x0;
      local_288.dims = 0;
      local_288.w = 0;
      local_288.h = 0;
      local_288.d = 0;
      local_288.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,this_00,&local_288,opt);
      Mat::reshape(&local_140,&local_288,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]),
                   (Allocator *)0x0);
      pvVar12 = local_1a0;
      if (local_140.refcount != (int *)0x0) {
        LOCK();
        *local_140.refcount = *local_140.refcount + 1;
        UNLOCK();
      }
      piVar15 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if (local_288.data != (void *)0x0) {
              free(local_288.data);
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_288.data = local_140.data;
      local_288.refcount._0_4_ = SUB84(local_140.refcount,0);
      local_288.refcount._4_4_ = (undefined4)((ulong)local_140.refcount >> 0x20);
      local_288.elemsize._0_4_ = (undefined4)local_140.elemsize;
      local_288.elemsize._4_4_ = (undefined4)(local_140.elemsize >> 0x20);
      local_288.elempack = local_140.elempack;
      local_288.allocator = local_140.allocator;
      local_288.dims = local_140.dims;
      local_288.w = local_140.w;
      local_288.h = local_140.h;
      local_288.c = local_140.c;
      local_288.d = local_140.d;
      local_288.cstep = local_140.cstep;
      if (local_140.refcount != (int *)0x0) {
        LOCK();
        *local_140.refcount = *local_140.refcount + -1;
        UNLOCK();
        if (*local_140.refcount == 0) {
          if (local_140.allocator == (Allocator *)0x0) {
            if (local_140.data != (void *)0x0) {
              free(local_140.data);
            }
          }
          else {
            (*(local_140.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = (pvVar12->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar15 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (pMVar3 != &local_288) {
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + 1;
          UNLOCK();
        }
        piVar15 = pMVar3->refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              if (pMVar3->data != (void *)0x0) {
                free(pMVar3->data);
              }
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->data = local_288.data;
        piVar15 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        pMVar3->refcount = piVar15;
        pMVar3->elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
        pMVar3->elempack = local_288.elempack;
        pMVar3->allocator = local_288.allocator;
        pMVar3->dims = local_288.dims;
        pMVar3->w = local_288.w;
        pMVar3->h = local_288.h;
        pMVar3->d = local_288.d;
        pMVar3->c = local_288.c;
        pMVar3->cstep = local_288.cstep;
      }
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if (local_288.data != (void *)0x0) {
              free(local_288.data);
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_c0.refcount != (int *)0x0) {
        LOCK();
        *local_c0.refcount = *local_c0.refcount + -1;
        UNLOCK();
        if (*local_c0.refcount == 0) {
          if (local_c0.allocator == (Allocator *)0x0) {
            if (local_c0.data != (void *)0x0) {
              free(local_c0.data);
            }
          }
          else {
            (*(local_c0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar21 = 0;
    }
  }
  piVar15 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if (local_1f8.data != (void *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int DeformableConv2D_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}